

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ClassesPrintOne(Dch_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  Aig_Man_t *p_00;
  long lVar4;
  
  p_00 = (Aig_Man_t *)p;
  Abc_Print((int)p,"{ ");
  lVar4 = 0;
  while( true ) {
    if (p->pClassSizes[pRepr->Id] <= lVar4) break;
    pObj = p->pId2Class[pRepr->Id][lVar4];
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar1 = pObj->Id;
      uVar2 = *(uint *)&pObj->field_0x1c;
      p_00 = p->pAig;
      uVar3 = Aig_SupportSize(p_00,pObj);
      Abc_Print((int)p_00,"%d(%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3);
    }
    lVar4 = lVar4 + 1;
  }
  Abc_Print((int)p_00,"}\n");
  return;
}

Assistant:

void Dch_ClassesPrintOne( Dch_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
    Abc_Print( 1, "}\n" );
}